

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modules.cpp
# Opt level: O0

void module_with_dependent_async_launch(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  Executor *this;
  anon_class_8_1_6ca262cf this_00;
  uint in_EDI;
  double __x;
  ResultBuilder DOCTEST_RB;
  type *future;
  type *task;
  Task m1_1;
  Taskflow f1;
  Task E;
  Task D;
  Task C;
  Task B;
  Task A;
  int cnt;
  Taskflow f0;
  Executor executor;
  Task *in_stack_fffffffffffffaf8;
  Taskflow *target;
  Result *res;
  Taskflow *in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb0c;
  future<void> *in_stack_fffffffffffffb10;
  Task *in_stack_fffffffffffffb18;
  Enum at;
  Taskflow *in_stack_fffffffffffffb20;
  anon_class_8_1_ba1d3cc9 *cs_3;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  FlowBuilder *in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  FlowBuilder *in_stack_fffffffffffffb58;
  anon_class_8_1_ba1d3cc9 *in_stack_fffffffffffffb70;
  int *in_stack_fffffffffffffb80;
  Expression_lhs<const_int_&> *in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffbe8;
  size_t in_stack_fffffffffffffbf0;
  Executor *in_stack_fffffffffffffbf8;
  undefined1 local_3e0 [72];
  Taskflow local_398;
  __pthread_internal_list *local_280;
  __pthread_internal_list *local_270;
  __pthread_internal_list *local_260;
  __pthread_internal_list *local_250;
  __pthread_internal_list *local_240;
  __pthread_internal_list local_22c [13];
  anon_class_8_1_ba1d3cc9 local_150 [42];
  
  this = (Executor *)(ulong)in_EDI;
  cs_3 = local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffbe8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11cbf6);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffb20);
  local_22c[0].__prev._0_4_ = 0;
  local_240 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:598:23),_nullptr>
            (in_stack_fffffffffffffb48,
             (anon_class_8_1_ba1d3cc9 *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  local_250 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:599:23),_nullptr>
            (in_stack_fffffffffffffb48,
             (anon_class_8_1_ba1d3cc9 *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  local_260 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:600:23),_nullptr>
            (in_stack_fffffffffffffb48,
             (anon_class_8_1_ba1d3cc9 *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  local_270 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:601:23),_nullptr>
            (in_stack_fffffffffffffb48,
             (anon_class_8_1_ba1d3cc9 *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  local_280 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:602:23),_nullptr>
            (in_stack_fffffffffffffb48,
             (anon_class_8_1_ba1d3cc9 *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffb20);
  local_398.super_FlowBuilder._graph = (Graph *)local_22c;
  target = &local_398;
  local_398._mutex.super___mutex_base._M_mutex.__align = (long)local_398.super_FlowBuilder._graph;
  local_398._mutex.super___mutex_base._M_mutex._8_8_ = local_398.super_FlowBuilder._graph;
  local_398._mutex.super___mutex_base._M_mutex._16_8_ = local_398.super_FlowBuilder._graph;
  local_398._mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)local_398.super_FlowBuilder._graph;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:613:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:614:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:615:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:616:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:617:5),_nullptr>
            (in_stack_fffffffffffffb58,
             (anon_class_8_1_ba1d3cc9 *)
             CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
             (anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffffb48,
             (anon_class_8_1_ba1d3cc9 *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),cs_3,
             in_stack_fffffffffffffb70);
  std::tie<tf::Task,tf::Task,tf::Task,tf::Task,tf::Task>
            (in_stack_fffffffffffffb18,(Task *)in_stack_fffffffffffffb10,
             (Task *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (Task *)in_stack_fffffffffffffb00,(Task *)target);
  std::tuple<tf::Task&,tf::Task&,tf::Task&,tf::Task&,tf::Task&>::operator=
            ((tuple<tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&> *)
             in_stack_fffffffffffffb00,
             (tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task,_tf::Task> *)target);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb00,(Task *)target);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb00,(Task *)target);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb00,(Task *)target);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb00,(Task *)target);
  tf::FlowBuilder::composed_of<tf::Taskflow>
            (in_stack_fffffffffffffb48,
             (Taskflow *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb00,(Task *)target);
  this_00 = tf::make_module_task<tf::Taskflow&>(target);
  tf::Executor::
  dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_module_hpp:14:10),_nullptr>
            ((Executor *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (anon_class_8_1_6ca262cf *)in_stack_fffffffffffffb00);
  at = (Enum)((ulong)local_3e0 >> 0x20);
  std::get<0ul,tf::AsyncTask,std::future<void>>((pair<tf::AsyncTask,_std::future<void>_> *)0x11cf0d)
  ;
  std::get<1ul,tf::AsyncTask,std::future<void>>((pair<tf::AsyncTask,_std::future<void>_> *)0x11cf1f)
  ;
  std::future<void>::get(in_stack_fffffffffffffb10);
  res = (Result *)0x19c880;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)this_00.target,at,(char *)in_stack_fffffffffffffb10,
             in_stack_fffffffffffffb0c,(char *)in_stack_fffffffffffffb00,"",(char *)this);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&stack0xfffffffffffffb5c,DT_REQUIRE);
  doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
            ((ExpressionDecomposer *)in_stack_fffffffffffffb00,(int *)res);
  doctest::detail::Expression_lhs<int_const&>::operator==
            (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffb00,res);
  doctest::detail::Result::~Result((Result *)0x11cffa);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffb90,__x);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffb00);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11d151);
    std::pair<tf::AsyncTask,_std::future<void>_>::~pair
              ((pair<tf::AsyncTask,_std::future<void>_> *)in_stack_fffffffffffffb00);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffffb00);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffffb00);
    tf::Executor::~Executor(this);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void module_with_dependent_async_launch(unsigned W) {

  tf::Executor executor(W);

  tf::Taskflow f0;

  int cnt {0};

  auto A = f0.emplace([&cnt](){ ++cnt; });
  auto B = f0.emplace([&cnt](){ ++cnt; });
  auto C = f0.emplace([&cnt](){ ++cnt; });
  auto D = f0.emplace([&cnt](){ ++cnt; });
  auto E = f0.emplace([&cnt](){ ++cnt; });

  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);

  tf::Taskflow f1;

  // module 1
  std::tie(A, B, C, D, E) = f1.emplace(
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; }
  );
  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);
  auto m1_1 = f1.composed_of(f0);
  E.precede(m1_1);

  auto [task, future] = executor.dependent_async(tf::make_module_task(f1)); 

  future.get();

  REQUIRE(cnt == 10);
}